

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_timer_fast.c
# Opt level: O3

void dump_timers(int line)

{
  return;
}

Assistant:

void dump_timers(int line) {
#if 0
    RBTreeIterator itr;
    RBTNode* node;
    RBTNode* node_next;
    my_clock_t current_ticks = my_clock();
    printf("=========================== %d\n", line);
    rbt_begin_iterate(&g_globals.timers, LeftRightWalk, &itr);
    node_next = rbt_iterate(&itr);
    while ((node = node_next) != NULL) {
        s_timer_t* timer = GET_PARENT_ADDR(node, s_timer_t, rbt_node);
        printf("timer: %p %d %d\n", timer->task, (int)timer->wakeup_ticks, (int)(timer->wakeup_ticks - current_ticks));
        node_next = rbt_iterate(&itr);
    }

    s_list_t* list;
    for (list = &g_globals.active_tasks.next; list != &g_globals.active_tasks; list = list->next) {
        s_task_t *task = GET_PARENT_ADDR(list, s_task_t, node);
        printf("task: %p\n", task);
    }
#else
    (void)line;
#endif
}